

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::internalBuildTailoring
          (RuleBasedCollator *this,UnicodeString *rules,int32_t strength,
          UColAttributeValue decompositionMode,UParseError *outParseError,UnicodeString *outReason,
          UErrorCode *errorCode)

{
  UBool UVar1;
  CollationTailoring *pCVar2;
  UnicodeString *__filename;
  UnicodeString local_2a0;
  char *local_260;
  char *reason;
  LocalPointer<icu_63::CollationTailoring> t;
  BundleImporter local_240;
  BundleImporter importer;
  undefined1 local_230 [4];
  UVersionInfo noVersion;
  CollationBuilder builder;
  CollationTailoring *base;
  UnicodeString *outReason_local;
  UParseError *outParseError_local;
  UColAttributeValue decompositionMode_local;
  int32_t strength_local;
  UnicodeString *rules_local;
  RuleBasedCollator *this_local;
  
  __filename = rules;
  pCVar2 = CollationRoot::getRoot(errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (outReason != (UnicodeString *)0x0) {
      UnicodeString::remove(outReason,(char *)__filename);
    }
    CollationBuilder::CollationBuilder((CollationBuilder *)local_230,pCVar2,errorCode);
    importer.super_Importer.super_UObject._vptr_UObject._4_4_ = 0;
    anon_unknown_26::BundleImporter::BundleImporter(&local_240);
    pCVar2 = CollationBuilder::parseAndBuild
                       ((CollationBuilder *)local_230,rules,
                        (uint8_t *)((long)&importer.super_Importer.super_UObject._vptr_UObject + 4),
                        &local_240.super_Importer,outParseError,errorCode);
    LocalPointer<icu_63::CollationTailoring>::LocalPointer
              ((LocalPointer<icu_63::CollationTailoring> *)&reason,pCVar2);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 == '\0') {
      pCVar2 = LocalPointerBase<icu_63::CollationTailoring>::operator->
                         ((LocalPointerBase<icu_63::CollationTailoring> *)&reason);
      Locale::setToBogus(&pCVar2->actualLocale);
      pCVar2 = LocalPointerBase<icu_63::CollationTailoring>::orphan
                         ((LocalPointerBase<icu_63::CollationTailoring> *)&reason);
      adoptTailoring(this,pCVar2,errorCode);
      if (strength != -1) {
        (*(this->super_Collator).super_UObject._vptr_UObject[0x17])
                  (this,5,(ulong)(uint)strength,errorCode);
      }
      if (decompositionMode != UCOL_DEFAULT) {
        (*(this->super_Collator).super_UObject._vptr_UObject[0x17])
                  (this,4,(ulong)(uint)decompositionMode,errorCode);
      }
    }
    else {
      local_260 = CollationBuilder::getErrorReason((CollationBuilder *)local_230);
      if ((local_260 != (char *)0x0) && (outReason != (UnicodeString *)0x0)) {
        UnicodeString::UnicodeString(&local_2a0,local_260,-1,kInvariant);
        UnicodeString::operator=(outReason,&local_2a0);
        UnicodeString::~UnicodeString(&local_2a0);
      }
    }
    LocalPointer<icu_63::CollationTailoring>::~LocalPointer
              ((LocalPointer<icu_63::CollationTailoring> *)&reason);
    anon_unknown_26::BundleImporter::~BundleImporter(&local_240);
    CollationBuilder::~CollationBuilder((CollationBuilder *)local_230);
  }
  return;
}

Assistant:

void
RuleBasedCollator::internalBuildTailoring(const UnicodeString &rules,
                                          int32_t strength,
                                          UColAttributeValue decompositionMode,
                                          UParseError *outParseError, UnicodeString *outReason,
                                          UErrorCode &errorCode) {
    const CollationTailoring *base = CollationRoot::getRoot(errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(outReason != NULL) { outReason->remove(); }
    CollationBuilder builder(base, errorCode);
    UVersionInfo noVersion = { 0, 0, 0, 0 };
    BundleImporter importer;
    LocalPointer<CollationTailoring> t(builder.parseAndBuild(rules, noVersion,
                                                             &importer,
                                                             outParseError, errorCode));
    if(U_FAILURE(errorCode)) {
        const char *reason = builder.getErrorReason();
        if(reason != NULL && outReason != NULL) {
            *outReason = UnicodeString(reason, -1, US_INV);
        }
        return;
    }
    t->actualLocale.setToBogus();
    adoptTailoring(t.orphan(), errorCode);
    // Set attributes after building the collator,
    // to keep the default settings consistent with the rule string.
    if(strength != UCOL_DEFAULT) {
        setAttribute(UCOL_STRENGTH, (UColAttributeValue)strength, errorCode);
    }
    if(decompositionMode != UCOL_DEFAULT) {
        setAttribute(UCOL_NORMALIZATION_MODE, decompositionMode, errorCode);
    }
}